

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

PrefixedLogger * __thiscall
phosg::PrefixedLogger::sub
          (PrefixedLogger *__return_storage_ptr__,PrefixedLogger *this,string *prefix,
          LogLevel min_level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::operator+(&local_40,&this->prefix,prefix);
  if (min_level == USE_DEFAULT) {
    min_level = this->min_level;
  }
  PrefixedLogger(__return_storage_ptr__,&local_40,min_level);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

PrefixedLogger PrefixedLogger::sub(const std::string& prefix, LogLevel min_level) const {
  return PrefixedLogger(this->prefix + prefix, min_level == LogLevel::USE_DEFAULT ? this->min_level : min_level);
}